

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bias.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeBias(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *this;
  string *psVar1;
  string *psVar2;
  ConvolutionLayerParams *pCVar3;
  unsigned_long uVar4;
  long lVar5;
  void *pvVar6;
  pointer pcVar7;
  long lVar8;
  uint __val;
  pointer plVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  Type *caffeLayer;
  Type *pTVar13;
  LogMessage *pLVar14;
  undefined8 *puVar15;
  long *plVar16;
  Type *pTVar17;
  BiasLayerParams *this_00;
  WeightParams *this_01;
  AddLayerParams *this_02;
  uint uVar18;
  ulong uVar19;
  int new_size;
  BiasParameter *pBVar20;
  uint __len;
  unsigned_long *puVar21;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  vector<long,_std::allocator<long>_> biasShape;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  undefined1 local_380 [56];
  vector<long,_std::allocator<long>_> local_348;
  int local_330;
  LogFinisher local_329;
  undefined1 local_328 [56];
  Type *local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  RepeatedPtrFieldBase *local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined1 local_2a8 [56];
  BiasParameter *local_270;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_268;
  LogMessage local_260;
  LogMessage local_228;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),
                          (int)*biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish);
  iVar11 = getLayerIndex(caffeLayer,in_stack_00000030);
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar11);
  pBVar20 = caffeLayer->bias_param_;
  if (pBVar20 == (BiasParameter *)0x0) {
    pBVar20 = (BiasParameter *)&caffe::_BiasParameter_default_instance_;
  }
  if (1 < (caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ - 1U) {
    local_380._0_8_ = local_380 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_380,"Must have 1 or 2 input(s)","");
    errorInCaffeProto((string *)local_380,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
  }
  if ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    local_380._0_8_ = local_380 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Must have 1 output","");
    errorInCaffeProto((string *)local_380,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
  }
  local_2d0 = in_stack_00000018;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_180);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_2c8,
              (value_type *)((caffeLayer->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  iVar11 = (caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if ((iVar11 == 1) && ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_380._0_8_ = local_380 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_380,"Bias parameters not found.","");
    errorInCaffeProto((string *)local_380,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
  }
  uVar12 = pBVar20->axis_ + 4;
  local_330 = iVar11;
  local_2f0 = pTVar13;
  if ((uVar12 < 8) && ((0x99U >> (uVar12 & 0x1f) & 1) != 0)) {
    local_380._0_8_ = local_380 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"axis","");
    uVar12 = pBVar20->axis_;
    __val = -uVar12;
    if (0 < (int)uVar12) {
      __val = uVar12;
    }
    __len = 1;
    if (9 < __val) {
      uVar19 = (ulong)__val;
      uVar10 = 4;
      do {
        __len = uVar10;
        uVar18 = (uint)uVar19;
        if (uVar18 < 100) {
          __len = __len - 2;
          goto LAB_003e2896;
        }
        if (uVar18 < 1000) {
          __len = __len - 1;
          goto LAB_003e2896;
        }
        if (uVar18 < 10000) goto LAB_003e2896;
        uVar19 = uVar19 / 10000;
        uVar10 = __len + 4;
      } while (99999 < uVar18);
      __len = __len + 1;
    }
LAB_003e2896:
    local_268 = in_stack_00000028;
    psVar1 = (caffeLayer->name_).ptr_;
    psVar2 = (caffeLayer->type_).ptr_;
    local_328._0_8_ = local_328 + 0x10;
    local_270 = pBVar20;
    std::__cxx11::string::_M_construct((ulong)local_328,(char)__len - (char)((int)uVar12 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_328._0_8_ + (ulong)(uVar12 >> 0x1f)),__len,__val);
    unsupportedCaffeParrameterWithOption((string *)local_380,psVar1,psVar2,(string *)local_328);
    pBVar20 = local_270;
    pTVar13 = local_2f0;
    iVar11 = local_330;
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
    in_stack_00000028 = local_268;
    if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
  }
  if (pBVar20->axis_ == 1) {
    if (iVar11 == 1) {
LAB_003e296d:
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_148,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_148);
      }
      iVar11 = local_330;
      puVar15 = *(undefined8 **)
                 ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar15 + 3) == 2) {
        local_380._0_8_ = local_380 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_380,"Bias of size 2D when axis = 1 is currently not supported",""
                  );
        errorInCaffeProto((string *)local_380,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
        if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
        }
      }
    }
  }
  else if ((iVar11 == 1) && (pBVar20->axis_ == -3)) goto LAB_003e296d;
  if (pBVar20->axis_ == 2) {
    if (iVar11 != 1) {
      local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      new_size = 1;
      goto LAB_003e313d;
    }
LAB_003e2a78:
    if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    iVar11 = local_330;
    puVar15 = *(undefined8 **)
               ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar15 == (undefined8 *)0x0) {
      puVar15 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar15 + 3) == 1) {
      local_380._0_8_ = local_380 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_380,"Bias of size 1D when axis = 2 is currently not supported","");
      errorInCaffeProto((string *)local_380,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
    }
  }
  else if ((iVar11 == 1) && (pBVar20->axis_ == -2)) goto LAB_003e2a78;
  local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  new_size = 1;
  if (iVar11 != 1) goto LAB_003e313d;
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  puVar15 = *(undefined8 **)
             ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar15 == (undefined8 *)0x0) {
    puVar15 = &caffe::_BlobShape_default_instance_;
  }
  iVar11 = *(int *)(puVar15 + 3);
  new_size = 1;
  if (iVar11 != 0) {
    if (iVar11 == 1) {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_260,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_260);
      }
      puVar15 = *(undefined8 **)
                 ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar15 + 3) < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_228);
      }
      local_380._0_8_ = *(long *)(puVar15[4] + 8);
      if (local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_348,
                   (iterator)
                   local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_380);
      }
      else {
        *local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_380._0_8_;
        local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      new_size = (int)local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar11 == 2) {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
      }
      puVar15 = *(undefined8 **)
                 ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar15 + 3) < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1b8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
      }
      local_380._0_8_ = *(long *)(puVar15[4] + 8);
      if (local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_348,
                   (iterator)
                   local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_380);
      }
      else {
        *local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_380._0_8_;
        local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar5 = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_260,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_260);
      }
      puVar15 = *(undefined8 **)
                 ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &caffe::_BlobShape_default_instance_;
      }
      if (*(int *)(puVar15 + 3) < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_228);
      }
      local_380._0_8_ = *(long *)(puVar15[4] + 0x10);
      if (local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_348,
                   (iterator)
                   local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_380);
      }
      else {
        *local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_380._0_8_;
        local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      new_size = (int)lVar5 *
                 (int)local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar11 - 3U < 2) {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      puVar15 = *(undefined8 **)
                 ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &caffe::_BlobShape_default_instance_;
      }
      plVar16 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar15 + 3),iVar11 - 3U);
      local_380._0_8_ = *plVar16;
      if (local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_348,
                   (iterator)
                   local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_380);
      }
      else {
        *local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_380._0_8_;
        local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar5 = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
      }
      puVar15 = *(undefined8 **)
                 ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &caffe::_BlobShape_default_instance_;
      }
      plVar16 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar15 + 3),iVar11 + -2);
      local_380._0_8_ = *plVar16;
      if (local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_348,
                   (iterator)
                   local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_380);
      }
      else {
        *local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_380._0_8_;
        local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar8 = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_1b8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_328,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
      }
      puVar15 = *(undefined8 **)
                 ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
      if (puVar15 == (undefined8 *)0x0) {
        puVar15 = &caffe::_BlobShape_default_instance_;
      }
      plVar16 = google::protobuf::RepeatedField<long>::Get
                          ((RepeatedField<long> *)(puVar15 + 3),iVar11 + -1);
      local_380._0_8_ = *plVar16;
      if (local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_348,
                   (iterator)
                   local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)local_380);
      }
      else {
        *local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_380._0_8_;
        local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      new_size = (int)lVar5 * (int)lVar8 *
                 (int)local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
      if (iVar11 == 4) {
        if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_260);
        }
        puVar15 = *(undefined8 **)
                   ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar15 == (undefined8 *)0x0) {
          puVar15 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar15 + 3) < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_228,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar14 = google::protobuf::internal::LogMessage::operator<<
                              (&local_228,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage(&local_228);
        }
        if (*(long *)(puVar15[4] + 8) != 1) {
          local_380._0_8_ = local_380 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"bias","");
          psVar1 = (caffeLayer->name_).ptr_;
          psVar2 = (caffeLayer->type_).ptr_;
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,"4D bias only supported when 1st dimension is 1","");
          unsupportedCaffeParrameterWithOption
                    ((string *)local_380,psVar1,psVar2,(string *)local_328);
          goto LAB_003e2f03;
        }
      }
    }
    else {
      local_380._0_8_ = local_380 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"bias","");
      psVar1 = (caffeLayer->name_).ptr_;
      psVar2 = (caffeLayer->type_).ptr_;
      local_328._0_8_ = local_328 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_328,">4D bias not supported","");
      unsupportedCaffeParrameterWithOption((string *)local_380,psVar1,psVar2,(string *)local_328);
LAB_003e2f03:
      if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
      }
      pTVar13 = local_2f0;
      if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
        pTVar13 = local_2f0;
      }
    }
  }
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  iVar11 = local_330;
  if (*(int *)((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18) !=
      new_size) {
    local_380._0_8_ = local_380 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_380,"Bias blob\'s size inconsistent with the blob dimensions","");
    errorInCaffeProto((string *)local_380,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
  }
LAB_003e313d:
  if (iVar11 == 1) {
    pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (local_2d0,(Type *)0x0);
    if ((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_328,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_328,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_328);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_2e8,
                (value_type *)((caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    convertCaffeMetadata
              ((caffeLayer->name_).ptr_,&local_2e8,&local_2c8,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_2d0,
               in_stack_00000028);
    if (pTVar17->_oneof_case_[0] != 0xfa) {
      CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar17);
      pTVar17->_oneof_case_[0] = 0xfa;
      this_00 = (BiasLayerParams *)operator_new(0x38);
      CoreML::Specification::BiasLayerParams::BiasLayerParams(this_00);
      (pTVar17->layer_).bias_ = this_00;
    }
    plVar9 = local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar3 = (pTVar17->layer_).convolution_;
    if (local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      puVar21 = (unsigned_long *)
                local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        uVar4 = *puVar21;
        if ((long)uVar4 < 0) {
          __assert_fail("dim >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Bias.cpp"
                        ,0x90,
                        "void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        iVar11 = (pCVar3->kernelsize_).total_size_;
        if ((pCVar3->kernelsize_).current_size_ == iVar11) {
          google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar3->kernelsize_,iVar11 + 1);
        }
        iVar11 = (pCVar3->kernelsize_).current_size_;
        (pCVar3->kernelsize_).current_size_ = iVar11 + 1;
        ((pCVar3->kernelsize_).rep_)->elements[iVar11] = uVar4;
        puVar21 = puVar21 + 1;
      } while (puVar21 != (unsigned_long *)plVar9);
    }
    pTVar13 = local_2f0;
    lVar5._0_4_ = (pCVar3->stride_).current_size_;
    lVar5._4_4_ = (pCVar3->stride_).total_size_;
    if (lVar5 == 0) {
      this_01 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(this_01);
      *(WeightParams **)&pCVar3->stride_ = this_01;
    }
    lVar5 = *(long *)&pCVar3->stride_;
    if (new_size < 0) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_2a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x46a);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_2a8,"CHECK failed: (new_size) >= (0): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_2a8);
    }
    this = (RepeatedField<float> *)(lVar5 + 0x10);
    if (this->current_size_ < new_size) {
      google::protobuf::RepeatedField<float>::Reserve(this,new_size);
      iVar11 = this->current_size_;
      if (iVar11 != new_size) {
        memset((void *)(*(long *)(lVar5 + 0x18) + (long)iVar11 * 4 + 8),0,
               (long)new_size * 4 + (long)iVar11 * -4);
      }
    }
    this->current_size_ = new_size;
    if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_380,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_380,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_329,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_380);
    }
    pvVar6 = ((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    if ((RepeatedField<float> *)((long)pvVar6 + 0x18) != this) {
      this->current_size_ = 0;
      iVar11 = ((RepeatedField<float> *)((long)pvVar6 + 0x18))->current_size_;
      if (iVar11 != 0) {
        google::protobuf::RepeatedField<float>::Reserve(this,iVar11);
        memcpy((void *)(*(long *)(lVar5 + 0x18) + (long)*(int *)(lVar5 + 0x10) * 4 + 8),
               (void *)(*(long *)((long)pvVar6 + 0x20) + 8),(long)*(int *)((long)pvVar6 + 0x18) << 2
              );
        *(int *)(lVar5 + 0x10) = *(int *)(lVar5 + 0x10) + *(int *)((long)pvVar6 + 0x18);
      }
    }
  }
  else {
    pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (local_2d0,(Type *)0x0);
    if ((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_328,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_328,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_380,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_328);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_2e8,
                (value_type *)((caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    if ((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_380,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_380,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_2a8,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_380);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_2e8,
                *(value_type **)((caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_ + 1));
    psVar1 = (caffeLayer->name_).ptr_;
    pcVar7 = (psVar1->_M_dataplus)._M_p;
    local_2a8._0_8_ = local_2a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a8,pcVar7,pcVar7 + psVar1->_M_string_length);
    std::__cxx11::string::append(local_2a8);
    convertCaffeMetadata
              ((string *)local_2a8,&local_2e8,&local_2c8,
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_2d0,
               in_stack_00000028);
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if (pTVar17->_oneof_case_[0] != 0xe6) {
      CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar17);
      pTVar17->_oneof_case_[0] = 0xe6;
      this_02 = (AddLayerParams *)operator_new(0x18);
      CoreML::Specification::AddLayerParams::AddLayerParams(this_02);
      (pTVar17->layer_).add_ = this_02;
    }
  }
  if ((unsigned_long *)
      local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (unsigned_long *)0x0) {
    operator_delete(local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    const caffe::BiasParameter& caffeLayerParams =  caffeLayer.bias_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Bias layer does not support all the functionality of Caffe Bias layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Bias layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have bias as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "bias" layer
     if bottom_size == 2 => add an MLkit "add" layer.     
     */
    
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (nBottom == 1){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("Bias parameters not found.",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to bias when it is a learned parameter
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob's size inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParams = specLayer->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParams->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_add",
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_add();
    }
}